

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void drft_backward(drft_lookup *l,float *data)

{
  uint uVar1;
  uint uVar2;
  int ip;
  float *pfVar3;
  int *piVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  int iVar10;
  int ido;
  int iVar11;
  ulong uVar12;
  int l1;
  
  uVar1 = l->n;
  lVar7 = (long)(int)uVar1;
  if (lVar7 != 1) {
    pfVar3 = l->trigcache;
    piVar4 = l->splitcache;
    uVar2 = piVar4[1];
    uVar12 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar12;
    }
    iVar10 = 0;
    iVar11 = 1;
    l1 = 1;
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      ip = piVar4[uVar12 + 2];
      ido = (int)uVar1 / (ip * l1);
      lVar5 = (long)iVar11;
      if (ip == 2) {
        pfVar6 = pfVar3;
        pfVar8 = data;
        if (iVar10 != 0) {
          pfVar6 = data;
          pfVar8 = pfVar3;
        }
        dradb2(ido,l1,pfVar8,pfVar6,pfVar3 + lVar7 + lVar5 + -1);
LAB_001bc8a2:
        iVar10 = 1 - iVar10;
      }
      else {
        if (ip == 3) {
          pfVar6 = pfVar3;
          pfVar8 = data;
          if (iVar10 != 0) {
            pfVar6 = data;
            pfVar8 = pfVar3;
          }
          dradb3(ido,l1,pfVar8,pfVar6,pfVar3 + lVar7 + lVar5 + -1,
                 pfVar3 + lVar7 + (long)(ido + iVar11) + -1);
          goto LAB_001bc8a2;
        }
        if (ip == 4) {
          pfVar6 = pfVar3;
          pfVar8 = data;
          if (iVar10 != 0) {
            pfVar6 = data;
            pfVar8 = pfVar3;
          }
          dradb4(ido,l1,pfVar8,pfVar6,pfVar3 + lVar7 + lVar5 + -1,
                 pfVar3 + lVar7 + (long)(ido + iVar11) + -1,
                 pfVar3 + lVar7 + (long)(ido + iVar11 + ido) + -1);
          goto LAB_001bc8a2;
        }
        pfVar6 = pfVar3;
        pfVar8 = data;
        if (iVar10 != 0) {
          pfVar6 = data;
          pfVar8 = pfVar3;
        }
        dradbg(ido,ip,l1,ido * l1,pfVar8,pfVar8,pfVar8,pfVar6,pfVar6,pfVar3 + lVar7 + lVar5 + -1);
        if (ido == 1) {
          iVar10 = 1 - iVar10;
        }
      }
      iVar11 = iVar11 + (ip + -1) * ido;
      l1 = ip * l1;
    }
    if (iVar10 != 0) {
      uVar12 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar12;
      }
      for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        data[uVar12] = pfVar3[uVar12];
      }
    }
  }
  return;
}

Assistant:

void drft_backward(drft_lookup *l,float *data){
  if (l->n==1)return;
  drftb1(l->n,data,l->trigcache,l->trigcache+l->n,l->splitcache);
}